

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_safe(char *source,char *dest,int compressedSize,int maxDecompressedSize)

{
  uint uVar1;
  BYTE aBVar2 [8];
  size_t sVar3;
  int iVar4;
  size_t __n;
  ulong __n_00;
  BYTE *pBVar5;
  BYTE *pBVar6;
  bool bVar7;
  size_t local_3d0;
  ulong local_3c8;
  ulong local_3b0;
  int maxDecompressedSize_local;
  int compressedSize_local;
  char *dest_local;
  char *source_local;
  BYTE *oCopyLimit;
  BYTE *copyEnd;
  BYTE *matchEnd;
  size_t mlen;
  BYTE *copyFrom_1;
  BYTE *endOfMatch_1;
  size_t restSize_1;
  size_t copySize_1;
  variable_length_error error_3;
  variable_length_error error_2;
  BYTE *copyFrom;
  BYTE *endOfMatch;
  size_t restSize;
  size_t copySize;
  variable_length_error error_1;
  variable_length_error error;
  size_t length;
  BYTE aBStack_300 [8];
  uint token;
  size_t offset;
  BYTE *match;
  BYTE *shortoend;
  BYTE *shortiend;
  int checkOffset;
  int safeDecode;
  BYTE *dictEnd;
  BYTE *cpy;
  BYTE *oend;
  BYTE *op;
  BYTE *iend;
  BYTE *ip;
  undefined8 local_2a0;
  BYTE *local_298;
  int local_28c;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  char *local_278;
  char *local_270;
  int local_264;
  BYTE *local_260;
  BYTE *e_1;
  BYTE *s_2;
  BYTE *d_1;
  BYTE *local_240;
  BYTE *local_238;
  BYTE *local_230;
  BYTE *e_5;
  BYTE *s_9;
  BYTE *d_5;
  size_t local_210;
  BYTE *local_208;
  BYTE *local_200;
  BYTE *e_6;
  BYTE *s_10;
  BYTE *d_6;
  BYTE *local_1e0;
  BYTE *local_1d8;
  BYTE *local_1d0;
  BYTE *e_4;
  BYTE *s_7;
  BYTE *d_4;
  BYTE *local_1b0;
  BYTE *local_1a8;
  uint local_1a0;
  uint local_19c;
  U32 s;
  U32 length_1;
  int local_190;
  int local_18c;
  BYTE *local_188;
  BYTE **local_180;
  uint local_174;
  uint local_170;
  uint local_16c;
  U32 s_3;
  U32 length_2;
  undefined4 local_160;
  int local_15c;
  BYTE *local_158;
  BYTE **local_150;
  uint local_144;
  uint local_140;
  uint local_13c;
  U32 s_6;
  U32 length_3;
  int local_130;
  int local_12c;
  BYTE *local_128;
  BYTE **local_120;
  uint local_114;
  uint local_110;
  uint local_10c;
  U32 s_8;
  U32 length_4;
  undefined4 local_100;
  int local_fc;
  BYTE *local_f8;
  BYTE **local_f0;
  uint local_e4;
  BYTE *local_e0;
  BYTE *e;
  BYTE *s_1;
  BYTE *d;
  BYTE *local_c0;
  BYTE *local_b8;
  BYTE *local_b0;
  BYTE *e_3;
  BYTE *s_5;
  BYTE *d_3;
  size_t local_90;
  BYTE *local_88;
  undefined2 local_80;
  undefined2 uStack_7e;
  undefined4 uStack_7c;
  BYTE v [8];
  BYTE *local_60;
  BYTE *local_48;
  BYTE *local_40;
  BYTE *e_2;
  BYTE *s_4;
  BYTE *d_2;
  
  local_284 = 1;
  local_288 = 0;
  local_28c = 0;
  local_2a0 = 0;
  ip = (BYTE *)0x0;
  if (source == (char *)0x0) {
    local_264 = -1;
  }
  else {
    op = (BYTE *)(source + compressedSize);
    cpy = (BYTE *)(dest + maxDecompressedSize);
    _checkOffset = 0;
    shortiend._4_4_ = 1;
    shortiend._0_4_ = 1;
    shortoend = op + -0x10;
    match = cpy + -0x20;
    if (maxDecompressedSize == 0) {
      bVar7 = false;
      if (compressedSize == 1) {
        bVar7 = *source == '\0';
      }
      local_264 = -1;
      if (bVar7) {
        local_264 = 0;
      }
    }
    else if (compressedSize == 0) {
      local_264 = -1;
    }
    else {
      oend = (BYTE *)dest;
      iend = (BYTE *)source;
      local_298 = (BYTE *)dest;
      local_280 = maxDecompressedSize;
      local_27c = compressedSize;
      local_278 = dest;
      local_270 = source;
      if (0x3f < (long)cpy - (long)dest) {
LAB_00151ea3:
        do {
          pBVar6 = iend + 1;
          length._4_4_ = (uint)*iend;
          _error_1 = (ulong)(*iend >> 4);
          if (_error_1 == 0xf) {
            copySize._4_4_ = 0;
            local_188 = op + -0xf;
            local_180 = &iend;
            local_18c = local_284;
            local_190 = local_284;
            _s = (undefined4 *)((long)&copySize + 4);
            local_19c = 0;
            iend = pBVar6;
            if ((local_284 == 0) || (pBVar6 < local_188)) {
              do {
                local_1a0 = (uint)**local_180;
                *local_180 = *local_180 + 1;
                local_19c = local_1a0 + local_19c;
                if ((local_18c != 0) && (local_188 <= *local_180)) {
                  *_s = 0xfffffffe;
                  local_174 = local_19c;
                  break;
                }
                local_174 = local_19c;
              } while (local_1a0 == 0xff);
            }
            else {
              copySize._4_4_ = -1;
              local_174 = 0;
            }
            _error_1 = local_174 + _error_1;
            if (((copySize._4_4_ == -1) || ((shortiend._4_4_ != 0 && (oend + _error_1 < oend)))) ||
               ((shortiend._4_4_ != 0 && (iend + _error_1 < iend)))) goto LAB_00153b51;
            dictEnd = oend + _error_1;
            pBVar6 = iend;
            local_19c = local_174;
            if (local_284 == 0) {
              if (cpy + -8 < dictEnd) goto LAB_00152f9d;
              local_238 = oend;
              local_240 = iend;
              s_2 = oend;
              e_1 = iend;
              do {
                *(undefined8 *)s_2 = *(undefined8 *)e_1;
                s_2 = s_2 + 8;
                e_1 = e_1 + 8;
                local_260 = dictEnd;
                d_1 = dictEnd;
              } while (s_2 < dictEnd);
            }
            else {
              if (cpy + -0x20 < dictEnd) goto LAB_00152f9d;
              if (op + -0x20 < iend + _error_1) goto LAB_00152f9d;
              local_b8 = oend;
              local_c0 = iend;
              s_1 = oend;
              e = iend;
              do {
                *(undefined8 *)s_1 = *(undefined8 *)e;
                *(undefined8 *)(s_1 + 8) = *(undefined8 *)(e + 8);
                *(undefined8 *)(s_1 + 0x10) = *(undefined8 *)(e + 0x10);
                *(undefined8 *)(s_1 + 0x18) = *(undefined8 *)(e + 0x18);
                s_1 = s_1 + 0x20;
                e = e + 0x20;
                local_e0 = dictEnd;
                d = dictEnd;
              } while (s_1 < dictEnd);
            }
            iend = iend + _error_1;
            oend = dictEnd;
          }
          else {
            dictEnd = oend + _error_1;
            if (local_284 == 0) {
              *(undefined8 *)oend = *(undefined8 *)pBVar6;
              if (8 < _error_1) {
                *(undefined8 *)(oend + 8) = *(undefined8 *)(iend + 9);
              }
            }
            else {
              if (op + -0x11 < pBVar6) goto LAB_00152f9d;
              *(undefined8 *)oend = *(undefined8 *)pBVar6;
              *(undefined8 *)(oend + 8) = *(undefined8 *)(iend + 9);
            }
            iend = pBVar6 + _error_1;
            oend = dictEnd;
          }
          dictEnd = oend;
          aBStack_300._0_2_ = LZ4_readLE16(iend);
          aBStack_300[2] = '\0';
          aBStack_300[3] = '\0';
          token._0_1_ = '\0';
          token._1_1_ = '\0';
          token._2_1_ = '\0';
          token._3_1_ = '\0';
          iend = iend + 2;
          offset = (size_t)(oend + -(long)aBStack_300);
          _error_1 = (ulong)(length._4_4_ & 0xf);
          if (_error_1 == 0xf) {
            copySize._0_4_ = 0;
            if (((int)shortiend == 0) || (local_298 <= (BYTE *)(offset + (long)ip))) {
              local_158 = op + -4;
              local_150 = &iend;
              local_15c = local_284;
              local_160 = 0;
              _s_3 = &copySize;
              local_16c = 0;
              do {
                local_170 = (uint)**local_150;
                *local_150 = *local_150 + 1;
                local_16c = local_170 + local_16c;
                if ((local_15c != 0) && (local_158 <= *local_150)) {
                  *(undefined4 *)_s_3 = 0xfffffffe;
                  local_144 = local_16c;
                  break;
                }
                local_144 = local_16c;
              } while (local_170 == 0xff);
              if (((int)copySize != 0) ||
                 ((shortiend._4_4_ != 0 && (oend + local_144 + _error_1 < oend))))
              goto LAB_00153b51;
              _error_1 = local_144 + _error_1 + 4;
              local_16c = local_144;
              if (cpy + -0x40 <= oend + _error_1) goto LAB_0015340c;
LAB_00152645:
              local_60 = oend;
              sVar3 = offset;
              aBVar2 = aBStack_300;
              if (((int)shortiend != 0) && (ip + offset < local_298)) goto LAB_00153b51;
              if ((local_28c == 2) && (offset < local_298)) {
                if (cpy + -5 < oend + _error_1) {
                  if (local_288 == 0) goto LAB_00153b51;
                  if (_error_1 < (ulong)((long)cpy - (long)oend)) {
                    local_3b0 = _error_1;
                  }
                  else {
                    local_3b0 = (long)cpy - (long)oend;
                  }
                  _error_1 = local_3b0;
                }
                if ((long)local_298 - offset < _error_1) {
                  restSize = (long)local_298 - offset;
                  endOfMatch = (BYTE *)(_error_1 - restSize);
                  memcpy(oend,(void *)(_checkOffset - restSize),restSize);
                  oend = oend + restSize;
                  if (oend + -(long)local_298 < endOfMatch) {
                    copyFrom = oend + (long)endOfMatch;
                    _error_3 = local_298;
                    while (oend < copyFrom) {
                      *oend = *_error_3;
                      _error_3 = _error_3 + 1;
                      oend = oend + 1;
                    }
                  }
                  else {
                    memcpy(oend,local_298,(size_t)endOfMatch);
                    oend = endOfMatch + (long)oend;
                  }
                }
                else {
                  memmove(oend,(void *)(_checkOffset - ((long)local_298 - offset)),_error_1);
                  oend = oend + _error_1;
                }
              }
              else {
                pBVar6 = oend + _error_1;
                dictEnd = pBVar6;
                if ((ulong)aBStack_300 < 0x10) {
                  v[0] = aBStack_300[0];
                  v[1] = aBStack_300[1];
                  v[2] = aBStack_300[2];
                  v[3] = aBStack_300[3];
                  v[4] = (BYTE)token;
                  v[5] = token._1_1_;
                  v[6] = token._2_1_;
                  v[7] = token._3_1_;
                  if (aBStack_300 == (BYTE  [8])0x1) {
                    memset(&local_80,(uint)*(byte *)offset,8);
                  }
                  else if (aBStack_300 == (BYTE  [8])0x2) {
                    local_80 = *(undefined2 *)offset;
                    uStack_7e = *(undefined2 *)offset;
                    uStack_7c = CONCAT22(uStack_7e,local_80);
                  }
                  else {
                    if (aBStack_300 != (BYTE  [8])0x4) {
                      if ((ulong)aBStack_300 < 8) {
                        LZ4_write32(oend,0);
                        *local_60 = *(BYTE *)sVar3;
                        local_60[1] = *(BYTE *)(sVar3 + 1);
                        local_60[2] = *(BYTE *)(sVar3 + 2);
                        local_60[3] = *(BYTE *)(sVar3 + 3);
                        uVar1 = inc32table[(long)aBVar2];
                        *(undefined4 *)(local_60 + 4) = *(undefined4 *)(sVar3 + uVar1);
                        local_48 = (BYTE *)((long)(sVar3 + uVar1) - (long)dec64table[(long)aBVar2]);
                      }
                      else {
                        *(undefined8 *)oend = *(undefined8 *)offset;
                        local_48 = (BYTE *)(offset + 8);
                      }
                      local_40 = local_60 + 8;
                      s_4 = local_40;
                      e_2 = local_48;
                      do {
                        *(undefined8 *)s_4 = *(undefined8 *)e_2;
                        s_4 = s_4 + 8;
                        e_2 = e_2 + 8;
                      } while (s_4 < pBVar6);
                      goto LAB_00152bc6;
                    }
                    local_80 = (undefined2)*(undefined4 *)offset;
                    uStack_7e = (undefined2)((uint)*(undefined4 *)offset >> 0x10);
                    uStack_7c = *(undefined4 *)offset;
                  }
                  *(ulong *)local_60 = CONCAT44(uStack_7c,CONCAT22(uStack_7e,local_80));
                  while (local_60 = local_60 + 8, local_60 < pBVar6) {
                    *(ulong *)local_60 = CONCAT44(uStack_7c,CONCAT22(uStack_7e,local_80));
                  }
                }
                else {
                  local_88 = oend;
                  local_90 = offset;
                  s_5 = oend;
                  e_3 = (BYTE *)offset;
                  do {
                    *(undefined8 *)s_5 = *(undefined8 *)e_3;
                    *(undefined8 *)(s_5 + 8) = *(undefined8 *)(e_3 + 8);
                    *(undefined8 *)(s_5 + 0x10) = *(undefined8 *)(e_3 + 0x10);
                    *(undefined8 *)(s_5 + 0x18) = *(undefined8 *)(e_3 + 0x18);
                    s_5 = s_5 + 0x20;
                    e_3 = e_3 + 0x20;
                    local_b0 = pBVar6;
                    d_3 = pBVar6;
                  } while (s_5 < pBVar6);
                }
LAB_00152bc6:
                oend = dictEnd;
              }
              goto LAB_00151ea3;
            }
            goto LAB_00153b51;
          }
          _error_1 = _error_1 + 4;
          if (cpy + -0x40 <= oend + _error_1) goto LAB_0015340c;
          if (((local_28c != 1) && (offset < local_298)) || ((ulong)aBStack_300 < 8))
          goto LAB_00152645;
          *(undefined8 *)oend = *(undefined8 *)offset;
          *(undefined8 *)(oend + 8) = *(undefined8 *)(offset + 8);
          *(undefined2 *)(oend + 0x10) = *(undefined2 *)(offset + 0x10);
          oend = oend + _error_1;
        } while( true );
      }
LAB_00152bd9:
      do {
        pBVar6 = iend + 1;
        length._4_4_ = (uint)*iend;
        _error_1 = (ulong)(*iend >> 4);
        iend = pBVar6;
        if (local_284 == 0) {
          if (_error_1 < 9) goto LAB_00152c2f;
LAB_00152dcf:
          if (_error_1 == 0xf) {
            copySize_1._4_4_ = 0;
            local_128 = op + -0xf;
            local_120 = &iend;
            local_12c = local_284;
            local_130 = local_284;
            _s_6 = (undefined4 *)((long)&copySize_1 + 4);
            local_13c = 0;
            if ((local_284 == 0) || (pBVar6 < local_128)) {
              do {
                local_140 = (uint)**local_120;
                *local_120 = *local_120 + 1;
                local_13c = local_140 + local_13c;
                if ((local_12c != 0) && (local_128 <= *local_120)) {
                  *_s_6 = 0xfffffffe;
                  local_114 = local_13c;
                  break;
                }
                local_114 = local_13c;
              } while (local_140 == 0xff);
            }
            else {
              copySize_1._4_4_ = -1;
              local_114 = 0;
            }
            _error_1 = local_114 + _error_1;
            if (((copySize_1._4_4_ == -1) || ((shortiend._4_4_ != 0 && (oend + _error_1 < oend))))
               || ((local_13c = local_114, shortiend._4_4_ != 0 && (iend + _error_1 < iend)))) {
LAB_00153b51:
              return -1 - ((int)iend - (int)local_270);
            }
          }
          dictEnd = oend + _error_1;
          pBVar6 = iend;
LAB_00152f9d:
          iend = pBVar6;
          if (((local_284 == 0) || ((dictEnd <= cpy + -0xc && (iend + _error_1 <= op + -8)))) &&
             ((local_284 != 0 || (dictEnd <= cpy + -8)))) {
            local_1a8 = oend;
            local_1b0 = iend;
            d_4 = dictEnd;
            s_7 = oend;
            e_4 = iend;
            local_1d0 = dictEnd;
            do {
              *(undefined8 *)s_7 = *(undefined8 *)e_4;
              s_7 = s_7 + 8;
              e_4 = e_4 + 8;
            } while (s_7 < dictEnd);
            iend = iend + _error_1;
            oend = dictEnd;
          }
          else {
            if (local_288 == 0) {
              if (((local_284 == 0) && (dictEnd != cpy)) ||
                 ((local_284 != 0 && ((iend + _error_1 != op || (cpy < dictEnd))))))
              goto LAB_00153b51;
            }
            else {
              if (op < iend + _error_1) {
                _error_1 = (long)op - (long)iend;
                dictEnd = oend + _error_1;
              }
              if (cpy < dictEnd) {
                dictEnd = cpy;
                _error_1 = (long)cpy - (long)oend;
              }
            }
            memmove(oend,iend,_error_1);
            iend = iend + _error_1;
            oend = oend + _error_1;
            if (((local_288 == 0) || (dictEnd == cpy)) || (op + -2 <= iend)) break;
          }
          aBStack_300._0_2_ = LZ4_readLE16(iend);
          aBStack_300[2] = '\0';
          aBStack_300[3] = '\0';
          token._0_1_ = '\0';
          token._1_1_ = '\0';
          token._2_1_ = '\0';
          token._3_1_ = '\0';
          iend = iend + 2;
          offset = (long)oend - (long)aBStack_300;
          _error_1 = (ulong)(length._4_4_ & 0xf);
        }
        else {
          if (_error_1 == 0xf) goto LAB_00152dcf;
LAB_00152c2f:
          if (local_284 != 0 && shortoend <= pBVar6 || match < oend) goto LAB_00152dcf;
          iVar4 = 8;
          if (local_284 != 0) {
            iVar4 = 0x10;
          }
          memcpy(oend,pBVar6,(long)iVar4);
          oend = oend + _error_1;
          iend = iend + _error_1;
          _error_1 = (ulong)(length._4_4_ & 0xf);
          aBStack_300._0_2_ = LZ4_readLE16(iend);
          aBStack_300[2] = '\0';
          aBStack_300[3] = '\0';
          token._0_1_ = '\0';
          token._1_1_ = '\0';
          token._2_1_ = '\0';
          token._3_1_ = '\0';
          iend = iend + 2;
          offset = (size_t)(oend + -(long)aBStack_300);
          if (((_error_1 != 0xf) && (7 < (ulong)aBStack_300)) &&
             ((local_28c == 1 || (local_298 <= offset)))) {
            *(undefined8 *)oend = *(undefined8 *)offset;
            *(undefined8 *)(oend + 8) = *(undefined8 *)(offset + 8);
            *(undefined2 *)(oend + 0x10) = *(undefined2 *)(offset + 0x10);
            oend = oend + _error_1 + 4;
            goto LAB_00152bd9;
          }
        }
        if (_error_1 == 0xf) {
          copySize_1._0_4_ = 0;
          local_f8 = op + -4;
          local_f0 = &iend;
          local_fc = local_284;
          local_100 = 0;
          _s_8 = &copySize_1;
          local_10c = 0;
          do {
            local_110 = (uint)**local_f0;
            *local_f0 = *local_f0 + 1;
            local_10c = local_110 + local_10c;
            if ((local_fc != 0) && (local_f8 <= *local_f0)) {
              *(undefined4 *)_s_8 = 0xfffffffe;
              local_e4 = local_10c;
              break;
            }
            local_e4 = local_10c;
          } while (local_110 == 0xff);
          _error_1 = local_e4 + _error_1;
          if (((int)copySize_1 != 0) ||
             ((local_10c = local_e4, shortiend._4_4_ != 0 && (oend + _error_1 < oend))))
          goto LAB_00153b51;
        }
        _error_1 = _error_1 + 4;
LAB_0015340c:
        if (((int)shortiend != 0) && (ip + offset < local_298)) goto LAB_00153b51;
        if ((local_28c == 2) && (offset < local_298)) {
          if (cpy + -5 < oend + _error_1) {
            if (local_288 == 0) goto LAB_00153b51;
            if (_error_1 < (ulong)((long)cpy - (long)oend)) {
              local_3c8 = _error_1;
            }
            else {
              local_3c8 = (long)cpy - (long)oend;
            }
            _error_1 = local_3c8;
          }
          if ((long)local_298 - offset < _error_1) {
            __n = (long)local_298 - offset;
            __n_00 = _error_1 - __n;
            memcpy(oend,(void *)(_checkOffset - __n),__n);
            oend = oend + __n;
            if ((ulong)((long)oend - (long)local_298) < __n_00) {
              pBVar6 = oend + __n_00;
              mlen = (size_t)local_298;
              while (oend < pBVar6) {
                *oend = *(BYTE *)mlen;
                mlen = mlen + 1;
                oend = oend + 1;
              }
            }
            else {
              memcpy(oend,local_298,__n_00);
              oend = oend + __n_00;
            }
          }
          else {
            memmove(oend,(void *)(_checkOffset - ((long)local_298 - offset)),_error_1);
            oend = oend + _error_1;
          }
          goto LAB_00152bd9;
        }
        dictEnd = oend + _error_1;
        if ((local_288 == 0) || (dictEnd <= cpy + -0xc)) {
          if ((ulong)aBStack_300 < 8) {
            LZ4_write32(oend,0);
            *oend = *(BYTE *)offset;
            oend[1] = *(BYTE *)(offset + 1);
            oend[2] = *(BYTE *)(offset + 2);
            oend[3] = *(BYTE *)(offset + 3);
            uVar1 = inc32table[(long)aBStack_300];
            *(undefined4 *)(oend + 4) = *(undefined4 *)(offset + uVar1);
            offset = (long)(offset + uVar1) - (long)dec64table[(long)aBStack_300];
          }
          else {
            *(undefined8 *)oend = *(undefined8 *)offset;
            offset = offset + 8;
          }
          pBVar6 = oend + 8;
          if (cpy + -0xc < dictEnd) {
            pBVar5 = cpy + -7;
            if (cpy + -5 < dictEnd) goto LAB_00153b51;
            oend = pBVar6;
            if (pBVar6 < pBVar5) {
              local_210 = offset;
              e_5 = (BYTE *)offset;
              s_9 = pBVar6;
              do {
                *(undefined8 *)s_9 = *(undefined8 *)e_5;
                s_9 = s_9 + 8;
                e_5 = e_5 + 8;
              } while (s_9 < pBVar5);
              offset = (size_t)(pBVar5 + (offset - (long)pBVar6));
              oend = pBVar5;
              local_208 = pBVar6;
              d_5 = pBVar5;
              local_230 = pBVar5;
            }
            while (oend < dictEnd) {
              *oend = *(BYTE *)offset;
              offset = offset + 1;
              oend = oend + 1;
            }
          }
          else {
            *(undefined8 *)pBVar6 = *(undefined8 *)offset;
            if (0x10 < _error_1) {
              local_1d8 = oend + 0x10;
              local_1e0 = (BYTE *)(offset + 8);
              d_6 = dictEnd;
              local_200 = dictEnd;
              e_6 = local_1e0;
              s_10 = local_1d8;
              do {
                *(undefined8 *)s_10 = *(undefined8 *)e_6;
                s_10 = s_10 + 8;
                e_6 = e_6 + 8;
              } while (s_10 < dictEnd);
            }
          }
          oend = dictEnd;
          goto LAB_00152bd9;
        }
        if (_error_1 < (ulong)((long)cpy - (long)oend)) {
          local_3d0 = _error_1;
        }
        else {
          local_3d0 = (long)cpy - (long)oend;
        }
        pBVar6 = oend + local_3d0;
        if (oend < (BYTE *)(offset + local_3d0)) {
          while (oend < pBVar6) {
            *oend = *(BYTE *)offset;
            offset = offset + 1;
            oend = oend + 1;
          }
        }
        else {
          memcpy(oend,(void *)offset,local_3d0);
        }
        oend = pBVar6;
      } while (pBVar6 != cpy);
      if (local_284 == 0) {
        local_264 = (int)iend - (int)local_270;
      }
      else {
        local_264 = (int)oend - (int)local_278;
      }
    }
  }
  return local_264;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe(const char* source, char* dest, int compressedSize, int maxDecompressedSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxDecompressedSize,
                                  endOnInputSize, decode_full_block, noDict,
                                  (BYTE*)dest, NULL, 0);
}